

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O2

BGZF * bgzf_hopen(hFILE *hfp,char *mode)

{
  ulong uVar1;
  char *pcVar2;
  BGZF *pBVar3;
  int *piVar4;
  
  uVar1 = compressBound(0xff00);
  if (0xffff < uVar1) {
    __assert_fail("compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                  ,0xd8,"BGZF *bgzf_hopen(hFILE *, const char *)");
  }
  pcVar2 = strchr(mode,0x72);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strchr(mode,0x77);
    if ((pcVar2 == (char *)0x0) && (pcVar2 = strchr(mode,0x61), pcVar2 == (char *)0x0)) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      return (BGZF *)0x0;
    }
    pBVar3 = bgzf_write_init(mode);
  }
  else {
    pBVar3 = bgzf_read_init(hfp);
    if (pBVar3 == (BGZF *)0x0) {
      return (BGZF *)0x0;
    }
  }
  pBVar3->fp = hfp;
  pBVar3->field_0x2 = pBVar3->field_0x2 & 0xf3;
  return pBVar3;
}

Assistant:

BGZF *bgzf_hopen(hFILE *hfp, const char *mode)
{
    BGZF *fp = NULL;
    assert(compressBound(BGZF_BLOCK_SIZE) < BGZF_MAX_BLOCK_SIZE);
    if (strchr(mode, 'r')) {
        fp = bgzf_read_init(hfp);
        if (fp == NULL) return NULL;
    } else if (strchr(mode, 'w') || strchr(mode, 'a')) {
        fp = bgzf_write_init(mode);
    }
    else { errno = EINVAL; return 0; }

    fp->fp = hfp;
    fp->is_be = ed_is_big();
    return fp;
}